

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t exr_get_name(exr_const_context_t ctxt,int part_index,char **out)

{
  long lVar1;
  exr_result_t eVar2;
  
  if (ctxt == (exr_const_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar2 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return eVar2;
  }
  if (out == (char **)0x0) {
    eVar2 = (**(code **)(ctxt + 0x48))(ctxt,3,"NULL output for \'name\'",*(code **)(ctxt + 0x48));
    return eVar2;
  }
  lVar1 = *(long *)(*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 0x68);
  if (lVar1 != 0) {
    if (*(int *)(lVar1 + 0x14) == 0x13) {
      *out = *(char **)(*(long *)(lVar1 + 0x18) + 8);
      return 0;
    }
    eVar2 = (**(code **)(ctxt + 0x48))
                      (ctxt,6,"Invalid required attribute type \'%s\' for \'name\'",
                       *(undefined8 *)(lVar1 + 8),*(code **)(ctxt + 0x48));
    return eVar2;
  }
  return 0xf;
}

Assistant:

exr_result_t
exr_get_name (exr_const_context_t ctxt, int part_index, const char** out)
{
    EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);
    if (!out)
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt, EXR_ERR_INVALID_ARGUMENT, "NULL output for 'name'"));

    if (part->name)
    {
        if (part->name->type != EXR_ATTR_STRING)
            return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_FILE_BAD_HEADER,
                "Invalid required attribute type '%s' for 'name'",
                part->name->type_name));
        *out = part->name->string->str;
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (EXR_ERR_SUCCESS);
    }
    return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (EXR_ERR_NO_ATTR_BY_NAME);
}